

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O3

void __thiscall
csm::ModelIdentifier::ModelIdentifier(ModelIdentifier *this,string *argName,string *argValue)

{
  _Rb_tree_header *p_Var1;
  Data DStack_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  local_50;
  
  p_Var1 = &(this->theComponents)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->theComponents)._M_t._M_impl = 0;
  *(undefined8 *)&(this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->theComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  MIC::Data::Data(&DStack_68,argValue);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::pair<csm::MIC::Data,_true>(&local_50,argName,&DStack_68);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,csm::MIC::Data>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,csm::MIC::Data>,std::_Select1st<std::pair<std::__cxx11::string_const,csm::MIC::Data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,csm::MIC::Data>>>
              *)this,&local_50);
  MIC::Data::~Data(&local_50.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  MIC::Data::~Data(&DStack_68);
  return;
}

Assistant:

ModelIdentifier::ModelIdentifier(const std::string& argName,
                                  const std::string& argValue)
   :
      theComponents()
{
   theComponents.insert(MIComponent(argName,MIC::Data(argValue)));
}